

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint *puVar19;
  bool bVar20;
  size_t sStack_60;
  char buffer [4];
  
  if (hbSize < 4) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,4);
    sStack_60 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sStack_60 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sStack_60 = sVar4;
    }
  }
  else {
    memset(normalizedCounter,0,(ulong)(*maxSVPtr + 1) * 2);
    uVar8 = *headerBuffer & 0xf;
    if (uVar8 < 0xb) {
      uVar17 = *headerBuffer >> 4;
      *tableLogPtr = uVar8 + 5;
      iVar13 = 0x20 << (sbyte)uVar8;
      iVar14 = iVar13 + 1;
      iVar9 = uVar8 + 6;
      uVar8 = *maxSVPtr;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar3 = 4;
      uVar15 = 0;
      puVar10 = (uint *)headerBuffer;
      while ((1 < iVar14 && ((uint)uVar15 <= uVar8))) {
        puVar12 = puVar10;
        if (!bVar20) {
          uVar7 = uVar3 + 2;
          uVar11 = uVar15;
          uVar5 = uVar3;
          while (uVar3 = uVar7, (short)uVar17 == -1) {
            if (puVar10 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar12 = (uint *)((long)puVar10 + 2);
              puVar10 = (uint *)((long)puVar10 + 2);
              uVar17 = *puVar12 >> ((byte)uVar5 & 0x1f);
              uVar11 = (ulong)((int)uVar11 + 0x18);
            }
            else {
              uVar17 = uVar17 >> 0x10;
              uVar5 = uVar5 + 0x10;
              uVar11 = (ulong)((int)uVar11 + 0x18);
              uVar7 = uVar7 + 0x10;
            }
          }
          for (; (~uVar17 & 3) == 0; uVar17 = uVar17 >> 2) {
            uVar11 = (ulong)((int)uVar11 + 3);
            uVar3 = uVar3 + 2;
          }
          uVar5 = (uVar17 & 3) + (int)uVar11;
          if (uVar8 < uVar5) {
            return 0xffffffffffffffd0;
          }
          for (; uVar15 < uVar5; uVar15 = uVar15 + 1) {
            normalizedCounter[uVar15] = 0;
          }
          iVar6 = (int)uVar3 >> 3;
          puVar12 = (uint *)((long)puVar10 + (long)iVar6);
          if ((puVar2 < puVar10) && (puVar19 < puVar12)) {
            uVar17 = uVar17 >> 2;
            puVar12 = puVar10;
          }
          else {
            uVar3 = uVar3 & 7;
            uVar17 = *(uint *)((long)puVar10 + (long)iVar6) >> (sbyte)uVar3;
          }
        }
        uVar5 = iVar13 * 2 - 1;
        uVar7 = uVar5 - iVar14;
        uVar16 = iVar13 - 1U & uVar17;
        if (uVar16 < uVar7) {
          iVar6 = iVar9 + -1;
        }
        else {
          uVar17 = uVar17 & uVar5;
          if ((int)uVar17 < iVar13) {
            uVar7 = 0;
          }
          uVar16 = uVar17 - uVar7;
          iVar6 = iVar9;
        }
        iVar1 = uVar16 - 1;
        iVar18 = 1 - uVar16;
        if (0 < (int)uVar16) {
          iVar18 = iVar1;
        }
        iVar14 = iVar14 - iVar18;
        normalizedCounter[uVar15 & 0xffffffff] = (short)iVar1;
        for (; iVar14 < iVar13; iVar13 = iVar13 >> 1) {
          iVar9 = iVar9 + -1;
        }
        uVar17 = iVar6 + uVar3;
        uVar15 = (ulong)((int)uVar15 + 1);
        bVar20 = iVar1 != 0;
        puVar10 = (uint *)((long)((int)uVar17 >> 3) + (long)puVar12);
        uVar3 = uVar17 & 7;
        if (puVar2 < puVar12 && puVar19 < puVar10) {
          puVar10 = puVar19;
          uVar3 = uVar17 + ((int)puVar12 - (int)puVar19) * 8;
        }
        uVar17 = *puVar10 >> ((byte)uVar3 & 0x1f);
      }
      sStack_60 = 0xffffffffffffffec;
      if ((iVar14 == 1) && ((int)uVar3 < 0x21)) {
        *maxSVPtr = (uint)uVar15 - 1;
        sStack_60 = (long)puVar10 + ((long)((int)(uVar3 + 7) >> 3) - (long)headerBuffer);
      }
    }
    else {
      sStack_60 = 0xffffffffffffffd4;
    }
  }
  return sStack_60;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    /* init */
    memset(normalizedCounter, 0, (*maxSVPtr+1) * sizeof(normalizedCounter[0]));   /* all symbols not present in NCount have a frequency of 0 */
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}